

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O3

int Doolittle64(uchar *mat,int *pivot,int n)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int i;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  byte bVar17;
  ulong uVar18;
  char cVar19;
  uint uVar20;
  uint uVar21;
  uchar *puVar22;
  long lVar23;
  uchar *puVar24;
  ulong uVar25;
  uchar *puVar26;
  int j;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  ulong local_60;
  
  uVar3 = n - 1;
  if (1 < n) {
    uVar7 = (ulong)((uint)n >> 3);
    uVar16 = (uint)n >> 6;
    uVar4 = uVar16 << 3;
    puVar24 = mat + uVar4;
    local_60 = 1;
    uVar5 = 0x11;
    puVar26 = mat;
    uVar13 = 0;
    do {
      uVar29 = (uint)uVar13;
      pivot[uVar13] = uVar29;
      uVar1 = uVar13 + 1;
      uVar8 = uVar13 >> 3 & 0x1fffffff;
      uVar10 = ~uVar29 & 7;
      lVar9 = uVar13 * uVar7;
      uVar12 = uVar13 & 0xffffffff;
      puVar22 = puVar24;
      uVar28 = uVar1;
      do {
        uVar25 = (ulong)(((~(uint)mat[uVar8 + lVar9] & (uint)mat[uVar28 * uVar7 + uVar8]) >> uVar10
                         & 1) != 0);
        uVar15 = -uVar25;
        if (0x3f < (uint)n) {
          uVar18 = 0;
          do {
            uVar2 = *(ulong *)(puVar22 + uVar18 * 8);
            *(ulong *)(puVar22 + uVar18 * 8) =
                 *(ulong *)(puVar26 + uVar18 * 8) & uVar15 | uVar2 & uVar25 - 1;
            *(ulong *)(puVar26 + uVar18 * 8) =
                 uVar2 & uVar15 | *(ulong *)(puVar26 + uVar18 * 8) & uVar25 - 1;
            uVar18 = uVar18 + 1;
          } while (uVar16 != uVar18);
        }
        uVar11 = (uint)uVar12;
        if (uVar25 != 0) {
          uVar11 = 0;
        }
        uVar11 = uVar11 | (uint)uVar15 & (uint)uVar28;
        uVar12 = (ulong)uVar11;
        pivot[uVar13] = uVar11;
        uVar28 = uVar28 + 1;
        puVar22 = puVar22 + uVar4;
      } while (uVar28 < (uint)n);
      if ((mat[uVar8 + (uVar29 * n >> 3)] >> uVar10 & 1) == 0) {
        return -1;
      }
      uVar11 = (uint)uVar1 & 7;
      uVar14 = (uint)uVar1 >> 3;
      cVar19 = (char)(0x100 >> (sbyte)uVar11);
      uVar11 = (uVar29 - uVar11) + 9;
      uVar13 = local_60;
      do {
        uVar28 = -(ulong)((mat[((uint)((int)uVar13 * n) >> 3) + uVar8] >> uVar10 & 1) != 0);
        lVar23 = uVar13 * uVar7;
        bVar17 = (byte)uVar28;
        mat[lVar23 + (ulong)uVar14] =
             (mat[lVar9 + (ulong)uVar14] & bVar17 ^ mat[lVar23 + (ulong)uVar14]) & cVar19 - 1U |
             mat[lVar23 + (ulong)uVar14] & -cVar19;
        uVar27 = uVar11;
        uVar21 = uVar5 & 0xfffffff8;
        if ((uVar11 & 0x3f) != 0 && (int)uVar11 < n) {
          do {
            uVar20 = uVar27 + 7;
            if (-1 < (int)uVar27) {
              uVar20 = uVar27;
            }
            mat[((int)uVar20 >> 3) + (int)lVar23] =
                 mat[((int)uVar20 >> 3) + (int)lVar23] ^
                 mat[((int)uVar20 >> 3) + (int)lVar9] & bVar17;
            uVar27 = uVar27 + 8;
          } while (((int)uVar21 < n) && (uVar20 = uVar21 & 0x3f, uVar21 = uVar21 + 8, uVar20 != 0));
        }
        if ((int)uVar27 < n) {
          do {
            uVar21 = uVar27 + 0x3f;
            if (-1 < (int)uVar27) {
              uVar21 = uVar27;
            }
            *(ulong *)(mat + (long)(int)(((int)uVar21 >> 6) + (int)uVar13 * uVar16) * 8) =
                 *(ulong *)(mat + (long)(int)(((int)uVar21 >> 6) + (int)uVar13 * uVar16) * 8) ^
                 *(ulong *)(mat + (long)(int)(((int)uVar21 >> 6) + uVar16 * uVar29) * 8) & uVar28;
            uVar27 = uVar27 + 0x40;
          } while ((int)uVar27 < n);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uint)n);
      local_60 = local_60 + 1;
      puVar26 = puVar26 + uVar4;
      puVar24 = puVar24 + uVar4;
      uVar5 = uVar5 + 1;
      uVar13 = uVar1;
    } while (uVar1 != uVar3);
  }
  pivot[(int)uVar3] = uVar3;
  iVar6 = n + 7;
  if (-1 < n) {
    iVar6 = n;
  }
  return (mat[(long)((iVar6 >> 3) * n) + -1] & 1) - 1;
}

Assistant:

int Doolittle64(unsigned char *mat, int *pivot, int n)
{
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    uint64_t tmp;
    for(uint64_t j = k+1; j < n; j++)
    {
      uint64_t mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/64; c++)
      {
        // copy in 32 bit chunks
        tmp = mat_64_ptr[(n/64)*j + c];
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*k + c] & mask_cpy);
        mat_64_ptr[(n/64)*k + c] = (mat_64_ptr[(n/64)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      uint64_t mask_ik = 0x0000000000000000 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;

      // handle byte-aligned chunks until we are 8-byte aligned
      int k_1_aligned = k+1 + (8-((k+1)%8));
      int k_8_aligned = k_1_aligned;
      for(int j = k_1_aligned; (j < n) && ((j%64) != 0); j += 8)
      {
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
        k_8_aligned = j+8;
      }

      /*
       * now handle the rest of the row efficiently in 4-byte-aligned byte-chunks
       */
      for(int j = k_8_aligned; j < n; j += 64)
      {
        mat_64_ptr[i*(n/64) + j/64] ^= mask_ik & mat_64_ptr[k*(n/64) + j/64];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}